

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.cc
# Opt level: O2

void __thiscall Object::visualizeEdges(Object *this,Mat *src,Point *obs)

{
  iterator *this_00;
  Matrix<double,_3,_1,_0,_3,_1> *pMVar1;
  size_type sVar2;
  reference pMVar3;
  _Elt_pointer pMVar4;
  _Elt_pointer pMVar5;
  ulong __n;
  uint uVar6;
  pointer this_01;
  allocator<char> local_105;
  uint local_104;
  undefined4 local_100 [2];
  Mat *local_f8;
  undefined8 local_f0;
  Matx<double,_4,_1> local_e8;
  double local_c8;
  double dStack_c0;
  Point *local_b0;
  pointer local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  Point local_68;
  char str [8];
  Matx<double,_4,_1> local_58;
  
  if (this->valid != false) {
    this_01 = (this->edges).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_a8 = (this->edges).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
               super__Vector_impl_data._M_finish;
    uVar6 = 0xffffffff;
    local_78 = 0;
    uStack_74 = 0;
    uStack_70 = 0;
    uStack_6c = 0x406fe000;
    local_b0 = obs;
    for (; this_01 != local_a8; this_01 = this_01 + 1) {
      uVar6 = uVar6 + 1;
      if (this_01->valid != false) {
        this_00 = &(this_01->
                   super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   ).
                   super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   ._M_impl.super__Deque_impl_data._M_start;
        __n = 1;
        local_104 = uVar6;
        while( true ) {
          sVar2 = std::
                  deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ::size(&this_01->
                          super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        );
          if (sVar2 <= __n) break;
          local_f0 = 0;
          local_100[0] = 0x3010000;
          local_f8 = src;
          pMVar3 = std::
                   _Deque_iterator<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_&,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_*>
                   ::operator[](this_00,__n - 1);
          local_c8 = (pMVar3->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                     m_storage.m_data.array[0];
          dStack_c0 = (pMVar3->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                      m_storage.m_data.array[1];
          pMVar3 = std::
                   _Deque_iterator<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_&,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_*>
                   ::operator[](this_00,__n - 1);
          local_80 = CONCAT44((int)(pMVar3->
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                                   m_storage.m_data.array[1],(int)local_c8);
          pMVar3 = std::
                   _Deque_iterator<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_&,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_*>
                   ::operator[](this_00,__n);
          local_c8 = (pMVar3->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                     m_storage.m_data.array[0];
          dStack_c0 = (pMVar3->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                      m_storage.m_data.array[1];
          pMVar3 = std::
                   _Deque_iterator<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_&,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_*>
                   ::operator[](this_00,__n);
          local_88 = CONCAT44((int)(pMVar3->
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                                   m_storage.m_data.array[1],(int)local_c8);
          cv::Matx<double,_4,_1>::Matx(&local_e8);
          local_e8.val[0] = (double)CONCAT44(uStack_74,local_78);
          local_e8.val[1] = (double)CONCAT44(uStack_6c,uStack_70);
          local_e8.val[2] = 255.0;
          local_e8.val[3] = 0.0;
          cv::line(local_100,&local_80,&local_88,(string *)&local_e8,3,8,0);
          __n = __n + 1;
        }
        sVar2 = std::
                deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                ::size(&this_01->
                        super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                      );
        snprintf(str,8,"%d:%lu",(ulong)local_104,sVar2);
        local_f0 = 0;
        local_100[0] = 0x3010000;
        local_f8 = src;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,str,&local_105);
        pMVar4 = (this_01->
                 super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 ).
                 super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur;
        local_90 = CONCAT44((int)(pMVar4->
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                                 m_storage.m_data.array[1] + 10,
                            (int)(pMVar4->
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                                 m_storage.m_data.array[0] + 10);
        cv::Matx<double,_4,_1>::Matx(&local_58);
        local_58.val[0] = (double)CONCAT44(uStack_74,local_78);
        local_58.val[1] = (double)CONCAT44(uStack_6c,uStack_70);
        local_58.val[2] = 0.0;
        local_58.val[3] = 0.0;
        cv::putText(0,local_100,(string *)&local_e8,&local_90,1,&local_58,1,8,0);
        std::__cxx11::string::~string((string *)&local_e8);
        local_f0 = 0;
        local_100[0] = 0x3010000;
        pMVar4 = (this_01->
                 super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 ).
                 super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur;
        local_98 = CONCAT44((int)(pMVar4->
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                                 m_storage.m_data.array[1],
                            (int)(pMVar4->
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                                 m_storage.m_data.array[0]);
        local_f8 = src;
        cv::Matx<double,_4,_1>::Matx(&local_e8);
        local_e8.val[0] = 255.0;
        local_e8.val[1] = 255.0;
        local_e8.val[2] = 0.0;
        local_e8.val[3] = 0.0;
        cv::circle(local_100,&local_98,3,(string *)&local_e8,0xffffffff,8,0);
        local_f0 = 0;
        local_100[0] = 0x3010000;
        pMVar4 = (this_01->
                 super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 ).
                 super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (pMVar4 == (this_01->
                      super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                      ).
                      super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_first) {
          pMVar1 = (this_01->
                   super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   ).
                   super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
          pMVar5 = pMVar1 + 0x14;
          pMVar4 = pMVar1 + 0x15;
        }
        else {
          pMVar5 = pMVar4 + -1;
        }
        local_a0 = CONCAT44((int)pMVar4[-1].
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                 m_storage.m_data.array[1],
                            (int)(pMVar5->
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                                 m_storage.m_data.array[0]);
        local_f8 = src;
        cv::Matx<double,_4,_1>::Matx(&local_e8);
        local_e8.val[0] = 255.0;
        local_e8.val[1] = 0.0;
        local_e8.val[2] = 255.0;
        local_e8.val[3] = 0.0;
        cv::circle(local_100,&local_a0,3,(string *)&local_e8,0xffffffff,8,0);
        uVar6 = local_104;
      }
    }
    local_f0 = 0;
    local_100[0] = 0x3010000;
    local_68 = *local_b0;
    local_f8 = src;
    cv::Matx<double,_4,_1>::Matx(&local_e8);
    local_e8.val[0] = 0.0;
    local_e8.val[1] = 255.0;
    local_e8.val[2] = 0.0;
    local_e8.val[3] = 0.0;
    cv::circle(local_100,&local_68,4,&local_e8,0xffffffffffffffff,8,0);
  }
  return;
}

Assistant:

void Object::visualizeEdges(cv::Mat& src, cv::Point obs) const{
    if (valid == false)
        return;
    int cnt = -1;
    for (const Edge& eg: edges) {
        cnt++;
        if (eg.valid == false) continue;
        for (size_t i = 1; i < eg.size(); i++) {
            cv::line(src, cv::Point(eg[i - 1].x(), eg[i - 1].y()), cv::Point(eg[i].x(), eg[i].y()), cv::Scalar(0, 255, 255), 3);
        }
        char str[8];
        snprintf(str, 8, "%d:%lu", cnt, eg.size());
		cv::putText(src, str, cv::Point(eg.front().x(), eg.front().y()) + cv::Point(10, 10),
					cv::FONT_HERSHEY_PLAIN, 1, cv::Scalar(0, 255, 0));
        cv::circle(src, cv::Point(eg.front().x(), eg.front().y()), 3, cv::Scalar(255, 255, 0), -1);
        cv::circle(src, cv::Point(eg.back().x(), eg.back().y()), 3, cv::Scalar(255, 0, 255), -1);
    }
    cv::circle(src, obs, 4, cv::Scalar(0, 255, 0), -1);
}